

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_val_delete(wasm_val_t *val)

{
  RefPtr<wabt::interp::Object> *this;
  
  if (val != (wasm_val_t *)0x0) {
    if ((char)val->kind < '\0') {
      this = &((val->of).ref)->I;
      if (this != (RefPtr<wabt::interp::Object> *)0x0) {
        wabt::interp::RefPtr<wabt::interp::Object>::reset(this);
      }
      operator_delete(this,0x18);
      (val->of).i64 = 0;
    }
    return;
  }
  __assert_fail("val",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x23a,"void wasm_val_delete(wasm_val_t *)");
}

Assistant:

void wasm_val_delete(own wasm_val_t* val) {
  assert(val);
  if (wasm_valkind_is_ref(val->kind)) {
    delete val->of.ref;
    val->of.ref = nullptr;
  }
}